

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_core_validation.cpp
# Opt level: O2

bool ValidateSystemExtensionDependencies
               (GenValidUsageXrInstanceInfo *gen_instance_info,string *command,string *struct_name,
               vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
               *objects_info,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *extensions)

{
  return true;
}

Assistant:

bool ValidateSystemExtensionDependencies(GenValidUsageXrInstanceInfo *gen_instance_info,
                                         const std::string &command,
                                         const std::string &struct_name,
                                         std::vector<GenValidUsageXrObjectInfo>& objects_info,
                                         std::vector<std::string> &extensions) {
    // No system extensions to check dependencies for
    (void)gen_instance_info;
    (void)command;
    (void)struct_name;
    (void)objects_info;
    (void)extensions;
    return true;
}